

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int ncnn::binary_op<std::divides<float>>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  float *pfVar3;
  Mat *in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  float fVar4;
  int i_12;
  int i_11;
  float b0_6;
  int x_3;
  float a0_5;
  int y_3;
  float *outptr_10;
  float *ptr1_6;
  int i_10;
  float *outptr_9;
  float *ptr1_5;
  float a0_4;
  int q_8;
  int i_9;
  float a0_3;
  int i_8;
  float a0_2;
  int i_7;
  float *outptr_8;
  float *ptr1_4;
  int q_7;
  float a0_1;
  int x_2;
  float b0_5;
  int y_2;
  float *outptr_7;
  float *ptr_7;
  int i_6;
  float b0_4;
  int i_5;
  int x_1;
  float a0;
  int y_1;
  float *outptr_6;
  float *ptr1_3;
  float *ptr_6;
  int q_6;
  int i_4;
  float *outptr_5;
  float b0_3;
  float *ptr_5;
  int q_5;
  int i_3;
  float *outptr_4;
  float *ptr_4;
  int q_4;
  float b0_2;
  int x;
  float b0_1;
  int y;
  float *outptr_3;
  float *ptr1_2;
  float *ptr_3;
  int q_3;
  int i_2;
  float *outptr_2;
  float *ptr1_1;
  float *ptr_2;
  int q_2;
  int i_1;
  float *outptr_1;
  float *ptr1;
  float *ptr_1;
  int q_1;
  int i;
  float *b0;
  float *outptr;
  float *ptr;
  int q;
  int size1;
  int channels1;
  int h1;
  int w1;
  size_t elemsize;
  int size;
  int channels;
  int h;
  int w;
  divides<float> op;
  Mat *in_stack_fffffffffffff840;
  undefined4 in_stack_fffffffffffff848;
  undefined4 in_stack_fffffffffffff84c;
  size_t in_stack_fffffffffffff850;
  int _c;
  int _h;
  undefined8 in_stack_fffffffffffff858;
  int _w;
  undefined4 in_stack_fffffffffffff860;
  undefined4 in_stack_fffffffffffff864;
  int local_6f0;
  int local_6ec;
  float local_6e8;
  int local_6e4;
  float local_6e0;
  int local_6dc;
  float *local_6d8;
  float *local_6d0;
  int local_6c4;
  Mat local_6c0;
  float *local_680;
  Mat local_678;
  float *local_638;
  float local_62c;
  int local_628;
  int local_624;
  float local_620;
  int local_61c;
  float local_618;
  int local_614;
  Mat local_610;
  float *local_5d0;
  Mat local_5c8;
  float *local_588;
  int local_57c;
  float local_578;
  int local_574;
  float local_570;
  int local_56c;
  float *local_568;
  float *local_560;
  int local_558;
  float local_554;
  int local_550;
  int local_54c;
  float local_548;
  int local_544;
  Mat local_540;
  float *local_500;
  Mat local_4f8;
  float *local_4b8;
  float *local_4b0;
  int local_4a8;
  int local_4a4;
  Mat local_4a0;
  float *local_460;
  float local_454;
  Mat local_450;
  float *local_410;
  int local_408;
  int local_404;
  Mat local_400;
  float *local_3c0;
  Mat local_3b8;
  float *local_378;
  int local_36c;
  float local_368;
  int local_364;
  float local_360;
  int local_35c;
  Mat local_358;
  float *local_318;
  float *local_310;
  Mat local_308;
  float *local_2c8;
  int local_2c0;
  int local_2bc;
  Mat local_2b8;
  float *local_278;
  Mat local_270;
  float *local_230;
  Mat local_228;
  float *local_1e8;
  int local_1e0;
  int local_1dc;
  Mat local_1d8;
  float *local_198;
  float *local_190;
  Mat local_188;
  float *local_148;
  int local_140;
  int local_13c;
  Mat local_138;
  float *local_f8;
  Mat local_f0;
  float *local_b0;
  Mat local_a8;
  float *local_68;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  size_t local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  divides<float> local_29 [9];
  Mat *local_20;
  Mat *local_18;
  Mat *local_10;
  
  local_30 = in_RDI->w;
  local_34 = in_RDI->h;
  local_38 = in_RDI->c;
  local_3c = local_30 * local_34;
  local_48 = in_RDI->elemsize;
  local_4c = in_RSI->w;
  local_50 = in_RSI->h;
  local_54 = in_RSI->c;
  local_58 = local_4c * local_50;
  _c = (int)(in_stack_fffffffffffff850 >> 0x20);
  _h = (int)in_stack_fffffffffffff858;
  _w = (int)((ulong)in_stack_fffffffffffff858 >> 0x20);
  local_18 = in_RSI;
  if (in_RDI->dims == 3) {
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),_w,_h,_c,
                CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                (Allocator *)in_stack_fffffffffffff840);
    bVar1 = Mat::empty(in_stack_fffffffffffff840);
    if (bVar1) {
      return -100;
    }
    if (local_18->dims == 3) {
      if (((local_4c == 1) && (local_50 == 1)) && (local_54 == local_38)) {
        for (local_5c = 0; local_5c < local_38; local_5c = local_5c + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                       (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_a8);
          Mat::~Mat((Mat *)0x1957fd);
          local_68 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                       (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_f0);
          Mat::~Mat((Mat *)0x19584b);
          local_b0 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                       (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_138);
          Mat::~Mat((Mat *)0x195899);
          local_f8 = pfVar2;
          for (local_13c = 0; local_13c < local_3c; local_13c = local_13c + 1) {
            fVar4 = std::divides<float>::operator()(local_29,local_68 + local_13c,local_f8);
            local_b0[local_13c] = fVar4;
          }
        }
        return 0;
      }
      if (((local_4c == local_30) && (local_50 == local_34)) && (local_54 == 1)) {
        for (local_140 = 0; local_140 < local_38; local_140 = local_140 + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                       (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_188);
          Mat::~Mat((Mat *)0x1959d3);
          local_148 = pfVar2;
          local_190 = Mat::operator_cast_to_float_(local_18);
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                       (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_1d8);
          Mat::~Mat((Mat *)0x195a36);
          local_198 = pfVar2;
          for (local_1dc = 0; local_1dc < local_3c; local_1dc = local_1dc + 1) {
            fVar4 = std::divides<float>::operator()
                              (local_29,local_148 + local_1dc,local_190 + local_1dc);
            local_198[local_1dc] = fVar4;
          }
        }
        return 0;
      }
      for (local_1e0 = 0; local_1e0 < local_38; local_1e0 = local_1e0 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                     (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_228);
        Mat::~Mat((Mat *)0x195b49);
        local_1e8 = pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                     (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_270);
        Mat::~Mat((Mat *)0x195b97);
        local_230 = pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                     (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_2b8);
        Mat::~Mat((Mat *)0x195be5);
        local_278 = pfVar2;
        for (local_2bc = 0; local_2bc < local_3c; local_2bc = local_2bc + 1) {
          fVar4 = std::divides<float>::operator()
                            (local_29,local_1e8 + local_2bc,local_230 + local_2bc);
          local_278[local_2bc] = fVar4;
        }
      }
      return 0;
    }
    if (local_18->dims == 2) {
      for (local_2c0 = 0; local_2c0 < local_38; local_2c0 = local_2c0 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                     (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_308);
        Mat::~Mat((Mat *)0x195d0a);
        local_2c8 = pfVar2;
        local_310 = Mat::row(local_18,local_2c0);
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                     (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_358);
        Mat::~Mat((Mat *)0x195d74);
        local_318 = pfVar2;
        for (local_35c = 0; local_35c < local_34; local_35c = local_35c + 1) {
          local_360 = local_310[local_35c];
          for (local_364 = 0; local_364 < local_30; local_364 = local_364 + 1) {
            fVar4 = std::divides<float>::operator()(local_29,local_2c8 + local_364,&local_360);
            local_318[local_364] = fVar4;
          }
          local_2c8 = local_2c8 + local_30;
          local_318 = local_318 + local_30;
        }
      }
      return 0;
    }
    if (local_18->dims == 1) {
      if (local_18->w == 1) {
        pfVar2 = Mat::operator[](local_18,0);
        local_368 = *pfVar2;
        for (local_36c = 0; local_36c < local_38; local_36c = local_36c + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                       (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_3b8);
          Mat::~Mat((Mat *)0x195f4a);
          local_378 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                       (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_400);
          Mat::~Mat((Mat *)0x195f95);
          local_3c0 = pfVar2;
          for (local_404 = 0; local_404 < local_3c; local_404 = local_404 + 1) {
            fVar4 = std::divides<float>::operator()(local_29,local_378 + local_404,&local_368);
            local_3c0[local_404] = fVar4;
          }
        }
        return 0;
      }
      for (local_408 = 0; local_408 < local_38; local_408 = local_408 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                     (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_450);
        Mat::~Mat((Mat *)0x196096);
        local_410 = pfVar2;
        pfVar2 = Mat::operator[](local_18,local_408);
        local_454 = *pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                     (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_4a0);
        Mat::~Mat((Mat *)0x1960ff);
        local_460 = pfVar2;
        for (local_4a4 = 0; local_4a4 < local_3c; local_4a4 = local_4a4 + 1) {
          fVar4 = std::divides<float>::operator()(local_29,local_410 + local_4a4,&local_454);
          local_460[local_4a4] = fVar4;
        }
      }
      return 0;
    }
  }
  else {
    local_20 = in_RDX;
    local_10 = in_RDI;
    if (in_RDI->dims == 2) {
      if (in_RSI->dims == 3) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                    (Allocator *)in_stack_fffffffffffff840);
        bVar1 = Mat::empty(in_stack_fffffffffffff840);
        if (!bVar1) {
          for (local_4a8 = 0; local_4a8 < local_54; local_4a8 = local_4a8 + 1) {
            local_4b0 = Mat::row(local_10,local_4a8);
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                         (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_4f8);
            Mat::~Mat((Mat *)0x19629b);
            local_4b8 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                         (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_540);
            Mat::~Mat((Mat *)0x1962e3);
            local_500 = pfVar2;
            for (local_544 = 0; local_544 < local_50; local_544 = local_544 + 1) {
              local_548 = local_4b0[local_544];
              for (local_54c = 0; local_54c < local_4c; local_54c = local_54c + 1) {
                fVar4 = std::divides<float>::operator()(local_29,&local_548,local_4b8 + local_54c);
                local_500[local_54c] = fVar4;
              }
              local_4b8 = local_4b8 + local_4c;
              local_500 = local_500 + local_4c;
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),_w,_h,
                  in_stack_fffffffffffff850,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
      bVar1 = Mat::empty(in_stack_fffffffffffff840);
      if (bVar1) {
        return -100;
      }
      if (local_18->dims == 2) {
        for (local_550 = 0; local_550 < local_3c; local_550 = local_550 + 1) {
          pfVar2 = Mat::operator[](local_10,local_550);
          pfVar3 = Mat::operator[](local_18,local_550);
          fVar4 = std::divides<float>::operator()(local_29,pfVar2,pfVar3);
          pfVar2 = Mat::operator[](local_20,local_550);
          *pfVar2 = fVar4;
        }
        return 0;
      }
      if (local_18->dims == 1) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                    (int)((ulong)in_stack_fffffffffffff858 >> 0x20),(int)in_stack_fffffffffffff858,
                    in_stack_fffffffffffff850,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
        bVar1 = Mat::empty(in_stack_fffffffffffff840);
        if (bVar1) {
          return -100;
        }
        if (local_18->w == 1) {
          pfVar2 = Mat::operator[](local_18,0);
          local_554 = *pfVar2;
          for (local_558 = 0; local_558 < local_3c; local_558 = local_558 + 1) {
            pfVar2 = Mat::operator[](local_10,local_558);
            fVar4 = std::divides<float>::operator()(local_29,pfVar2,&local_554);
            pfVar2 = Mat::operator[](local_20,local_558);
            *pfVar2 = fVar4;
          }
          return 0;
        }
        local_560 = Mat::operator_cast_to_float_(local_10);
        local_568 = Mat::operator_cast_to_float_(local_20);
        for (local_56c = 0; local_56c < local_34; local_56c = local_56c + 1) {
          pfVar2 = Mat::operator[](local_18,local_56c);
          local_570 = *pfVar2;
          for (local_574 = 0; local_574 < local_30; local_574 = local_574 + 1) {
            fVar4 = std::divides<float>::operator()(local_29,local_560 + local_574,&local_570);
            local_568[local_574] = fVar4;
          }
          local_560 = local_560 + local_30;
          local_568 = local_568 + local_30;
        }
        return 0;
      }
    }
    else if (in_RDI->dims == 1) {
      if (in_RDI->w == 1) {
        if (in_RSI->dims == 3) {
          Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),_w,_h,_c,
                      CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                      (Allocator *)in_stack_fffffffffffff840);
          bVar1 = Mat::empty(in_stack_fffffffffffff840);
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_578 = *pfVar2;
            for (local_57c = 0; local_57c < local_54; local_57c = local_57c + 1) {
              Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                           (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
              pfVar2 = Mat::operator_cast_to_float_(&local_5c8);
              Mat::~Mat((Mat *)0x196892);
              local_588 = pfVar2;
              Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                           (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
              pfVar2 = Mat::operator_cast_to_float_(&local_610);
              Mat::~Mat((Mat *)0x1968da);
              local_5d0 = pfVar2;
              for (local_614 = 0; local_614 < local_58; local_614 = local_614 + 1) {
                fVar4 = std::divides<float>::operator()(local_29,&local_578,local_588 + local_614);
                local_5d0[local_614] = fVar4;
              }
            }
            return 0;
          }
          return -100;
        }
        if (in_RSI->dims == 2) {
          Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),_w,_h,
                      in_stack_fffffffffffff850,
                      (Allocator *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
          bVar1 = Mat::empty(in_stack_fffffffffffff840);
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_618 = *pfVar2;
            for (local_61c = 0; local_61c < local_58; local_61c = local_61c + 1) {
              pfVar2 = Mat::operator[](local_18,local_61c);
              fVar4 = std::divides<float>::operator()(local_29,&local_618,pfVar2);
              pfVar2 = Mat::operator[](local_20,local_61c);
              *pfVar2 = fVar4;
            }
            return 0;
          }
          return -100;
        }
        if (in_RSI->dims == 1) {
          Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),_w,
                      in_stack_fffffffffffff850,
                      (Allocator *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
          bVar1 = Mat::empty(in_stack_fffffffffffff840);
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_620 = *pfVar2;
            for (local_624 = 0; local_624 < local_4c; local_624 = local_624 + 1) {
              pfVar2 = Mat::operator[](local_18,local_624);
              fVar4 = std::divides<float>::operator()(local_29,&local_620,pfVar2);
              pfVar2 = Mat::operator[](local_20,local_624);
              *pfVar2 = fVar4;
            }
            return 0;
          }
          return -100;
        }
      }
      if (in_RSI->dims == 3) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                    (Allocator *)in_stack_fffffffffffff840);
        bVar1 = Mat::empty(in_stack_fffffffffffff840);
        if (!bVar1) {
          for (local_628 = 0; local_628 < local_54; local_628 = local_628 + 1) {
            pfVar2 = Mat::operator[](local_10,local_628);
            local_62c = *pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                         (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_678);
            Mat::~Mat((Mat *)0x196c7b);
            local_638 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                         (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_6c0);
            Mat::~Mat((Mat *)0x196cc3);
            local_680 = pfVar2;
            for (local_6c4 = 0; local_6c4 < local_58; local_6c4 = local_6c4 + 1) {
              fVar4 = std::divides<float>::operator()(local_29,&local_62c,local_638 + local_6c4);
              local_680[local_6c4] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (in_RSI->dims == 2) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),_w,_h,
                    in_stack_fffffffffffff850,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
        bVar1 = Mat::empty(in_stack_fffffffffffff840);
        if (!bVar1) {
          local_6d0 = Mat::operator_cast_to_float_(local_18);
          local_6d8 = Mat::operator_cast_to_float_(local_20);
          for (local_6dc = 0; local_6dc < local_50; local_6dc = local_6dc + 1) {
            pfVar2 = Mat::operator[](local_10,local_6dc);
            local_6e0 = *pfVar2;
            for (local_6e4 = 0; local_6e4 < local_4c; local_6e4 = local_6e4 + 1) {
              fVar4 = std::divides<float>::operator()(local_29,&local_6e0,local_6d0 + local_6e4);
              local_6d8[local_6e4] = fVar4;
            }
            local_6d0 = local_6d0 + local_4c;
            local_6d8 = local_6d8 + local_4c;
          }
          return 0;
        }
        return -100;
      }
      if (in_RSI->dims == 1) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),_w,
                    in_stack_fffffffffffff850,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
        bVar1 = Mat::empty(in_stack_fffffffffffff840);
        if (bVar1) {
          return -100;
        }
        if (local_18->w == 1) {
          pfVar2 = Mat::operator[](local_18,0);
          local_6e8 = *pfVar2;
          for (local_6ec = 0; local_6ec < local_30; local_6ec = local_6ec + 1) {
            pfVar2 = Mat::operator[](local_10,local_6ec);
            fVar4 = std::divides<float>::operator()(local_29,pfVar2,&local_6e8);
            pfVar2 = Mat::operator[](local_20,local_6ec);
            *pfVar2 = fVar4;
          }
          return 0;
        }
        for (local_6f0 = 0; local_6f0 < local_30; local_6f0 = local_6f0 + 1) {
          pfVar2 = Mat::operator[](local_10,local_6f0);
          pfVar3 = Mat::operator[](local_18,local_6f0);
          fVar4 = std::divides<float>::operator()(local_29,pfVar2,pfVar3);
          pfVar2 = Mat::operator[](local_20,local_6f0);
          *pfVar2 = fVar4;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int binary_op(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int size = w * h;
    size_t elemsize = a.elemsize;

    int w1 = b.w;
    int h1 = b.h;
    int channels1 = b.c;
    int size1 = w1 * h1;

    if (a.dims == 3)
    {
        c.create(w, h, channels, elemsize, opt.blob_allocator);
        if (c.empty())
            return -100;

        if (b.dims == 3)
        {
            if (w1 == 1 && h1 == 1 && channels1 == channels)
            {
                // special type 1
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = a.channel(q);
                    float* outptr = c.channel(q);
                    const float* b0 = b.channel(q);
                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = op(ptr[i], b0[0]);
                    }
                }

                return 0;
            }

            if (w1 == w && h1 == h && channels1 == 1)
            {
                // special type 2
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = a.channel(q);
                    const float* ptr1 = b;
                    float* outptr = c.channel(q);
                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = op(ptr[i], ptr1[i]);
                    }
                }

                return 0;
            }

            // type 19
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = op(ptr[i], ptr1[i]);
                }
            }

            return 0;
        }

        if (b.dims == 2)
        {
            // type 18
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                const float* ptr1 = b.row(q);
                float* outptr = c.channel(q);

                for (int y=0; y<h; y++)
                {
                    const float b0 = ptr1[y];
                    for (int x=0; x<w; x++)
                    {
                        outptr[x] = op(ptr[x], b0);
                    }

                    ptr += w;
                    outptr += w;
                }
            }

            return 0;
        }

        if (b.dims == 1)
        {
            if (b.w == 1)
            {
                // type 16
                const float b0 = b[0];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = a.channel(q);
                    float* outptr = c.channel(q);

                    for (int i=0; i<size; i++)
                    {
                        outptr[i] = op(ptr[i], b0);
                    }
                }

                return 0;
            }

            // type 17
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                const float b0 = b[q];
                float* outptr = c.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = op(ptr[i], b0);
                }
            }

            return 0;
        }
    }
    else if (a.dims == 2)
    {
        if (b.dims == 3)
        {
            // type 14
            c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels1; q++)
            {
                const float* ptr = a.row(q);
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int y=0; y<h1; y++)
                {
                    const float a0 = ptr[y];
                    for (int x=0; x<w1; x++)
                    {
                        outptr[x] = op(a0, ptr1[x]);
                    }

                    ptr1 += w1;
                    outptr += w1;
                }
            }

            return 0;
        }

        c.create(w, h, elemsize, opt.blob_allocator);
        if (c.empty())
            return -100;

        if (b.dims == 2)
        {
            // type 13
            for (int i=0; i<size; i++)
            {
                c[i] = op(a[i], b[i]);
            }

            return 0;
        }

        if (b.dims == 1)
        {
            c.create(w, h, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            if (b.w == 1)
            {
                // type 11
                const float b0 = b[0];
                for (int i=0; i<size; i++)
                {
                    c[i] = op(a[i], b0);
                }

                return 0;
            }

            // type 12
            const float* ptr = a;
            float* outptr = c;

            for (int y=0; y<h; y++)
            {
                const float b0 = b[y];
                for (int x=0; x<w; x++)
                {
                    outptr[x] = op(ptr[x], b0);
                }

                ptr += w;
                outptr += w;
            }

            return 0;
        }
    }
    else if (a.dims == 1)
    {
        if (a.w == 1)
        {
            if (b.dims == 3)
            {
                // type 4
                c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q=0; q<channels1; q++)
                {
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);

                    for (int i=0; i<size1; i++)
                    {
                        outptr[i] = op(a0, ptr1[i]);
                    }
                }

                return 0;
            }

            if (b.dims == 2)
            {
                // type 3
                c.create(w1, h1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                for (int i=0; i<size1; i++)
                {
                    c[i] = op(a0, b[i]);
                }

                return 0;
            }

            if (b.dims == 1)
            {
                // type 2
                c.create(w1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                for (int i=0; i<w1; i++)
                {
                    c[i] = op(a0, b[i]);
                }

                return 0;
            }
        }

        if (b.dims == 3)
        {
            // type 9
            c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels1; q++)
            {
                const float a0 = a[q];
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int i=0; i<size1; i++)
                {
                    outptr[i] = op(a0, ptr1[i]);
                }
            }

            return 0;
        }

        if (b.dims == 2)
        {
            // type 8
            c.create(w1, h1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            const float* ptr1 = b;
            float* outptr = c;

            for (int y=0; y<h1; y++)
            {
                const float a0 = a[y];
                for (int x=0; x<w1; x++)
                {
                    outptr[x] = op(a0, ptr1[x]);
                }

                ptr1 += w1;
                outptr += w1;
            }

            return 0;
        }

        if (b.dims == 1)
        {
            c.create(w, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            if (b.w == 1)
            {
                // type 6
                const float b0 = b[0];
                for (int i=0; i<w; i++)
                {
                    c[i] = op(a[i], b0);
                }

                return 0;
            }

            // type 7
            for (int i=0; i<w; i++)
            {
                c[i] = op(a[i], b[i]);
            }
        }
    }

    return 0;
}